

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestCaseFilters::shouldInclude(TestCaseFilters *this,TestCase *testCase)

{
  bool bVar1;
  pointer this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tags;
  pointer pTVar2;
  __normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
  local_50;
  const_iterator itEnd;
  const_iterator it;
  const_iterator itEnd_2;
  const_iterator it_2;
  const_iterator itEnd_1;
  const_iterator it_1;
  TestCase *testCase_local;
  TestCaseFilters *this_local;
  
  bVar1 = std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::empty
                    (&this->m_tagExpressions);
  if (!bVar1) {
    itEnd_1 = std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::begin
                        (&this->m_tagExpressions);
    it_2._M_current =
         (TestCaseFilter *)
         std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::end
                   (&this->m_tagExpressions);
    while (bVar1 = __gnu_cxx::operator!=
                             (&itEnd_1,(__normal_iterator<const_Catch::TagExpression_*,_std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>_>
                                        *)&it_2), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_Catch::TagExpression_*,_std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>_>
                ::operator->(&itEnd_1);
      tags = TestCase::getTags_abi_cxx11_(testCase);
      bVar1 = TagExpression::matches(this_00,tags);
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_Catch::TagExpression_*,_std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>_>
      ::operator++(&itEnd_1);
    }
    bVar1 = __gnu_cxx::operator==
                      (&itEnd_1,(__normal_iterator<const_Catch::TagExpression_*,_std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>_>
                                 *)&it_2);
    if (bVar1) {
      return false;
    }
  }
  bVar1 = std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::empty
                    (&this->m_inclusionFilters);
  if (bVar1) {
    bVar1 = std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::empty
                      (&this->m_exclusionFilters);
    if ((bVar1) &&
       (bVar1 = std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::empty
                          (&this->m_tagExpressions), bVar1)) {
      bVar1 = TestCase::isHidden(testCase);
      return (bool)((bVar1 ^ 0xffU) & 1);
    }
  }
  else {
    itEnd_2 = std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::begin
                        (&this->m_inclusionFilters);
    it = std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::end
                   (&this->m_inclusionFilters);
    while (bVar1 = __gnu_cxx::operator!=(&itEnd_2,&it), bVar1) {
      pTVar2 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
               ::operator->(&itEnd_2);
      bVar1 = TestCaseFilter::shouldInclude(pTVar2,testCase);
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
      ::operator++(&itEnd_2);
    }
    bVar1 = __gnu_cxx::operator==(&itEnd_2,&it);
    if (bVar1) {
      return false;
    }
  }
  itEnd = std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::begin
                    (&this->m_exclusionFilters);
  local_50._M_current =
       (TestCaseFilter *)
       std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::end
                 (&this->m_exclusionFilters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&itEnd,&local_50);
    if (!bVar1) {
      return true;
    }
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
             ::operator->(&itEnd);
    bVar1 = TestCaseFilter::shouldInclude(pTVar2,testCase);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
    ::operator++(&itEnd);
  }
  return false;
}

Assistant:

bool shouldInclude( TestCase const& testCase ) const {
            if( !m_tagExpressions.empty() ) {
                std::vector<TagExpression>::const_iterator it = m_tagExpressions.begin();
                std::vector<TagExpression>::const_iterator itEnd = m_tagExpressions.end();
                for(; it != itEnd; ++it )
                    if( it->matches( testCase.getTags() ) )
                        break;
                if( it == itEnd )
                    return false;
            }

            if( !m_inclusionFilters.empty() ) {
                std::vector<TestCaseFilter>::const_iterator it = m_inclusionFilters.begin();
                std::vector<TestCaseFilter>::const_iterator itEnd = m_inclusionFilters.end();
                for(; it != itEnd; ++it )
                    if( it->shouldInclude( testCase ) )
                        break;
                if( it == itEnd )
                    return false;
            }
            else if( m_exclusionFilters.empty() && m_tagExpressions.empty() ) {
                return !testCase.isHidden();
            }

            std::vector<TestCaseFilter>::const_iterator it = m_exclusionFilters.begin();
            std::vector<TestCaseFilter>::const_iterator itEnd = m_exclusionFilters.end();
            for(; it != itEnd; ++it )
                if( !it->shouldInclude( testCase ) )
                    return false;
            return true;
        }